

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_decompress.c
# Opt level: O0

size_t ZSTD_getFrameHeader_advanced
                 (ZSTD_frameHeader *zfhPtr,void *src,size_t srcSize,ZSTD_format_e format)

{
  byte bVar1;
  U16 UVar2;
  U32 UVar3;
  uint uVar4;
  uint uVar5;
  ZSTD_frameHeader *pZVar6;
  uint local_a0;
  U32 windowLog;
  BYTE wlByte;
  U64 frameContentSize;
  ulong uStack_70;
  U32 dictID;
  U64 windowSize;
  U32 fcsID;
  U32 singleSegment;
  U32 checksumFlag;
  U32 dictIDSizeCode;
  size_t pos;
  BYTE fhdByte;
  size_t fhsize;
  size_t minInputSize;
  BYTE *ip;
  ZSTD_format_e format_local;
  size_t srcSize_local;
  void *src_local;
  ZSTD_frameHeader *zfhPtr_local;
  
  pZVar6 = (ZSTD_frameHeader *)ZSTD_startingInputLength(format);
  memset(zfhPtr,0,0x28);
  zfhPtr_local = pZVar6;
  if (pZVar6 <= srcSize) {
    if (src == (void *)0x0) {
      zfhPtr_local = (ZSTD_frameHeader *)0xffffffffffffffff;
    }
    else if ((format == ZSTD_f_zstd1_magicless) || (UVar3 = MEM_readLE32(src), UVar3 == 0xfd2fb528))
    {
      zfhPtr_local = (ZSTD_frameHeader *)ZSTD_frameHeaderSize_internal(src,srcSize,format);
      if (zfhPtr_local <= srcSize) {
        zfhPtr->headerSize = (uint)zfhPtr_local;
        bVar1 = *(byte *)((long)src + (long)&pZVar6[-1].field_0x27);
        uVar4 = (int)(uint)bVar1 >> 5 & 1;
        uStack_70 = 0;
        frameContentSize._4_4_ = 0;
        _windowLog = 0xffffffffffffffff;
        if ((bVar1 & 8) == 0) {
          _checksumFlag = pZVar6;
          if (uVar4 == 0) {
            _checksumFlag = (ZSTD_frameHeader *)((long)&pZVar6->frameContentSize + 1);
            uVar5 = ((int)(uint)*(byte *)((long)src + (long)pZVar6) >> 3) + 10;
            if (0x1f < uVar5) {
              return 0xfffffffffffffff0;
            }
            uStack_70 = 1L << (sbyte)uVar5;
            uStack_70 = (uStack_70 >> 3) * (long)(int)(*(byte *)((long)src + (long)pZVar6) & 7) +
                        uStack_70;
          }
          switch(bVar1 & 3) {
          default:
            break;
          case 1:
            frameContentSize._4_4_ = (U32)*(byte *)((long)src + (long)_checksumFlag);
            _checksumFlag = (ZSTD_frameHeader *)((long)&_checksumFlag->frameContentSize + 1);
            break;
          case 2:
            UVar2 = MEM_readLE16((void *)((long)src + (long)_checksumFlag));
            frameContentSize._4_4_ = (U32)UVar2;
            _checksumFlag = (ZSTD_frameHeader *)((long)&_checksumFlag->frameContentSize + 2);
            break;
          case 3:
            frameContentSize._4_4_ = MEM_readLE32((void *)((long)src + (long)_checksumFlag));
            _checksumFlag = (ZSTD_frameHeader *)((long)&_checksumFlag->frameContentSize + 4);
          }
          switch((int)(uint)bVar1 >> 6) {
          default:
            if (uVar4 != 0) {
              _windowLog = (U64)*(byte *)((long)src + (long)_checksumFlag);
            }
            break;
          case 1:
            UVar2 = MEM_readLE16((void *)((long)src + (long)_checksumFlag));
            _windowLog = (U64)(int)(UVar2 + 0x100);
            break;
          case 2:
            UVar3 = MEM_readLE32((void *)((long)src + (long)_checksumFlag));
            _windowLog = (U64)UVar3;
            break;
          case 3:
            _windowLog = MEM_readLE64((void *)((long)src + (long)_checksumFlag));
          }
          if (uVar4 != 0) {
            uStack_70 = _windowLog;
          }
          zfhPtr->frameType = ZSTD_frame;
          zfhPtr->frameContentSize = _windowLog;
          zfhPtr->windowSize = uStack_70;
          if (uStack_70 < 0x20000) {
            local_a0 = (uint)uStack_70;
          }
          else {
            local_a0 = 0x20000;
          }
          zfhPtr->blockSizeMax = local_a0;
          zfhPtr->dictID = frameContentSize._4_4_;
          zfhPtr->checksumFlag = (int)(uint)bVar1 >> 2 & 1;
          zfhPtr_local = (ZSTD_frameHeader *)0x0;
        }
        else {
          zfhPtr_local = (ZSTD_frameHeader *)0xfffffffffffffff2;
        }
      }
    }
    else {
      UVar3 = MEM_readLE32(src);
      if ((UVar3 & 0xfffffff0) == 0x184d2a50) {
        if (srcSize < 8) {
          zfhPtr_local = (ZSTD_frameHeader *)0x8;
        }
        else {
          memset(zfhPtr,0,0x28);
          UVar3 = MEM_readLE32((void *)((long)src + 4));
          zfhPtr->frameContentSize = (ulong)UVar3;
          zfhPtr->frameType = ZSTD_skippableFrame;
          zfhPtr_local = (ZSTD_frameHeader *)0x0;
        }
      }
      else {
        zfhPtr_local = (ZSTD_frameHeader *)0xfffffffffffffff6;
      }
    }
  }
  return (size_t)zfhPtr_local;
}

Assistant:

size_t ZSTD_getFrameHeader_advanced(ZSTD_frameHeader* zfhPtr, const void* src, size_t srcSize, ZSTD_format_e format)
{
    const BYTE* ip = (const BYTE*)src;
    size_t const minInputSize = ZSTD_startingInputLength(format);

    memset(zfhPtr, 0, sizeof(*zfhPtr));   /* not strictly necessary, but static analyzer do not understand that zfhPtr is only going to be read only if return value is zero, since they are 2 different signals */
    if (srcSize < minInputSize) return minInputSize;
    RETURN_ERROR_IF(src==NULL, GENERIC, "invalid parameter");

    if ( (format != ZSTD_f_zstd1_magicless)
      && (MEM_readLE32(src) != ZSTD_MAGICNUMBER) ) {
        if ((MEM_readLE32(src) & ZSTD_MAGIC_SKIPPABLE_MASK) == ZSTD_MAGIC_SKIPPABLE_START) {
            /* skippable frame */
            if (srcSize < ZSTD_SKIPPABLEHEADERSIZE)
                return ZSTD_SKIPPABLEHEADERSIZE; /* magic number + frame length */
            memset(zfhPtr, 0, sizeof(*zfhPtr));
            zfhPtr->frameContentSize = MEM_readLE32((const char *)src + ZSTD_FRAMEIDSIZE);
            zfhPtr->frameType = ZSTD_skippableFrame;
            return 0;
        }
        RETURN_ERROR(prefix_unknown);
    }

    /* ensure there is enough `srcSize` to fully read/decode frame header */
    {   size_t const fhsize = ZSTD_frameHeaderSize_internal(src, srcSize, format);
        if (srcSize < fhsize) return fhsize;
        zfhPtr->headerSize = (U32)fhsize;
    }

    {   BYTE const fhdByte = ip[minInputSize-1];
        size_t pos = minInputSize;
        U32 const dictIDSizeCode = fhdByte&3;
        U32 const checksumFlag = (fhdByte>>2)&1;
        U32 const singleSegment = (fhdByte>>5)&1;
        U32 const fcsID = fhdByte>>6;
        U64 windowSize = 0;
        U32 dictID = 0;
        U64 frameContentSize = ZSTD_CONTENTSIZE_UNKNOWN;
        RETURN_ERROR_IF((fhdByte & 0x08) != 0, frameParameter_unsupported,
                        "reserved bits, must be zero");

        if (!singleSegment) {
            BYTE const wlByte = ip[pos++];
            U32 const windowLog = (wlByte >> 3) + ZSTD_WINDOWLOG_ABSOLUTEMIN;
            RETURN_ERROR_IF(windowLog > ZSTD_WINDOWLOG_MAX, frameParameter_windowTooLarge);
            windowSize = (1ULL << windowLog);
            windowSize += (windowSize >> 3) * (wlByte&7);
        }
        switch(dictIDSizeCode)
        {
            default: assert(0);  /* impossible */
            case 0 : break;
            case 1 : dictID = ip[pos]; pos++; break;
            case 2 : dictID = MEM_readLE16(ip+pos); pos+=2; break;
            case 3 : dictID = MEM_readLE32(ip+pos); pos+=4; break;
        }
        switch(fcsID)
        {
            default: assert(0);  /* impossible */
            case 0 : if (singleSegment) frameContentSize = ip[pos]; break;
            case 1 : frameContentSize = MEM_readLE16(ip+pos)+256; break;
            case 2 : frameContentSize = MEM_readLE32(ip+pos); break;
            case 3 : frameContentSize = MEM_readLE64(ip+pos); break;
        }
        if (singleSegment) windowSize = frameContentSize;

        zfhPtr->frameType = ZSTD_frame;
        zfhPtr->frameContentSize = frameContentSize;
        zfhPtr->windowSize = windowSize;
        zfhPtr->blockSizeMax = (unsigned) MIN(windowSize, ZSTD_BLOCKSIZE_MAX);
        zfhPtr->dictID = dictID;
        zfhPtr->checksumFlag = checksumFlag;
    }
    return 0;
}